

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::ParseEXRHeader
              (HeaderInfo *info,bool *empty_header,EXRVersion *version,string *err,uchar *buf,
              size_t size)

{
  undefined3 uVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_type sVar8;
  uint *puVar9;
  byte *pbVar10;
  reference pvVar11;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *pvVar12;
  char *pcVar13;
  void *__dest;
  ostream *poVar14;
  string *in_RCX;
  long in_RDX;
  undefined1 *in_RSI;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *in_RDI;
  char *in_R8;
  long in_R9;
  stringstream ss_err;
  EXRAttribute attrib;
  size_t len_1;
  size_t len;
  bool ok;
  uchar tile_mode;
  uint y_size;
  uint x_size;
  size_t marker_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attr_type;
  string attr_name;
  size_t nattr;
  size_t orig_size;
  bool has_type;
  bool has_name;
  bool has_screen_window_width;
  bool has_screen_window_center;
  bool has_pixel_aspect_ratio;
  bool has_line_order;
  bool has_display_window;
  bool has_data_window;
  bool has_compression;
  bool has_channels;
  char *marker;
  value_type_conflict6 *in_stack_fffffffffffff988;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  value_type *in_stack_fffffffffffff998;
  vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *in_stack_fffffffffffff9a0;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *in_stack_fffffffffffffa10;
  pointer *in_stack_fffffffffffffa18;
  undefined4 *in_stack_fffffffffffffa20;
  reference in_stack_fffffffffffffa28;
  size_t *in_stack_fffffffffffffa30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffa38;
  string *in_stack_fffffffffffffa40;
  string *in_stack_fffffffffffffa48;
  string local_4d0 [32];
  string local_4b0 [32];
  stringstream local_490 [16];
  ostream local_480 [376];
  char local_308 [255];
  undefined1 local_209;
  char local_208 [255];
  undefined1 local_109;
  void *local_108;
  undefined4 local_100;
  size_t local_f8;
  undefined1 local_e9;
  size_t local_e8;
  undefined1 local_db;
  byte local_da;
  byte local_d9;
  uint local_d8;
  uint local_d4;
  int local_d0;
  long local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  string local_a0 [32];
  string local_80 [32];
  ulong local_60;
  long local_58;
  byte local_4a;
  byte local_49;
  byte local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  char *local_40;
  long local_38;
  string *local_28;
  long local_20;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *local_10;
  int local_4;
  
  if (in_RSI != (undefined1 *)0x0) {
    *in_RSI = 0;
  }
  if (((*(int *)(in_RDX + 0x10) == 0) || (in_R9 == 0)) || (*in_R8 != '\0')) {
    local_41 = 0;
    local_42 = 0;
    local_43 = 0;
    local_44 = 0;
    local_45 = 0;
    local_46 = 0;
    local_47 = 0;
    local_48 = 0;
    local_49 = 0;
    local_4a = 0;
    local_40 = in_R8;
    local_38 = in_R9;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_10 = in_RDI;
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
    *(undefined4 *)
     &local_10[2].super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = 0;
    *(undefined4 *)
     ((long)&local_10[2].
             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
             _M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined4 *)
     &local_10[2].super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = 0;
    *(undefined4 *)
     ((long)&local_10[2].
             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined4 *)
     &local_10[2].super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
    *(undefined4 *)
     ((long)&local_10[2].
             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined4 *)
     &local_10[3].super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = 0;
    *(undefined4 *)
     ((long)&local_10[3].
             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
             _M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined4 *)
     &local_10[3].super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = 0;
    *(undefined4 *)
     ((long)&local_10[3].
             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined4 *)
     &local_10[3].super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
    *(undefined4 *)
     ((long)&local_10[3].
             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0xbf800000;
    *(undefined4 *)
     &local_10[4].super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = 0xbf800000;
    *(undefined4 *)
     &local_10[4].super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = 0;
    *(undefined4 *)
     ((long)&local_10[4].
             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish + 4) = 0xffffffff;
    *(undefined4 *)
     &local_10[4].super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = 0xffffffff;
    *(undefined4 *)
     ((long)&local_10[4].
             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0xffffffff;
    *(undefined4 *)
     &local_10[5].super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = 0xffffffff;
    std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::clear
              ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)0x5019a3);
    local_58 = local_38;
    for (local_60 = 0; local_60 < 0x400; local_60 = local_60 + 1) {
      if (local_38 == 0) {
        if (local_28 != (string *)0x0) {
          std::__cxx11::string::operator+=(local_28,"Insufficient data size for attributes.\n");
        }
        return -4;
      }
      if (*local_40 == '\0') {
        local_38 = local_38 + -1;
        break;
      }
      std::__cxx11::string::string(local_80);
      std::__cxx11::string::string(local_a0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x501a76);
      bVar3 = ReadAttribute(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                            in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                            (char *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
      if (bVar3) {
        local_40 = local_40 + local_c0;
        local_38 = local_38 - local_c0;
        if ((((*(int *)(local_20 + 4) == 0) && (*(int *)(local_20 + 0x10) == 0)) &&
            (*(int *)(local_20 + 0xc) == 0)) ||
           (iVar5 = std::__cxx11::string::compare((char *)local_80), iVar5 != 0)) {
          iVar5 = std::__cxx11::string::compare((char *)local_80);
          if (iVar5 == 0) {
            local_da = 0;
            pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&local_b8,0);
            if (*pbVar10 < 4) {
              local_da = 1;
            }
            pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&local_b8,0);
            if (*pvVar11 == '\x04') {
              local_da = 1;
            }
            pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&local_b8,0);
            if (*pvVar11 == 0x80) {
              if (local_28 != (string *)0x0) {
                std::__cxx11::string::operator=(local_28,"ZFP compression is not supported.");
              }
              local_4 = -8;
              local_d0 = 1;
            }
            else {
              if ((local_da & 1) != 0) {
                pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                    (&local_b8,0);
                *(uint *)&local_10[5].
                          super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (uint)*pbVar10;
                local_42 = 1;
                goto LAB_005028e8;
              }
              if (local_28 != (string *)0x0) {
                std::__cxx11::string::operator=(local_28,"Unknown compression type.");
              }
              local_4 = -8;
              local_d0 = 1;
            }
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)local_80);
            if (iVar5 == 0) {
              bVar3 = ReadChannelInfo((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                       *)in_stack_fffffffffffffa18,
                                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      in_stack_fffffffffffffa10);
              if (bVar3) {
                sVar8 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                        size(local_10);
                if (sVar8 != 0) {
                  local_41 = 1;
                  goto LAB_005028e8;
                }
                if (local_28 != (string *)0x0) {
                  std::__cxx11::string::operator+=(local_28,"# of channels is zero.\n");
                }
                local_4 = -4;
                local_d0 = 1;
              }
              else {
                if (local_28 != (string *)0x0) {
                  std::__cxx11::string::operator+=(local_28,"Failed to parse channel info.\n");
                }
                local_4 = -4;
                local_d0 = 1;
              }
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)local_80);
              if (iVar5 == 0) {
                sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_b8);
                if (0xf < sVar8) {
                  pvVar12 = local_10 + 2;
                  pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990)
                                       ,(size_type)in_stack_fffffffffffff988);
                  *(undefined4 *)
                   &(pvVar12->
                    super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pvVar11;
                  pvVar12 = local_10 + 2;
                  pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990)
                                       ,(size_type)in_stack_fffffffffffff988);
                  *(undefined4 *)
                   ((long)&(pvVar12->
                           super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                           )._M_impl.super__Vector_impl_data._M_start + 4) = *(undefined4 *)pvVar11;
                  pvVar12 = local_10 + 2;
                  pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990)
                                       ,(size_type)in_stack_fffffffffffff988);
                  *(undefined4 *)
                   &(pvVar12->
                    super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                    )._M_impl.super__Vector_impl_data._M_finish = *(undefined4 *)pvVar11;
                  pvVar12 = local_10 + 2;
                  pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990)
                                       ,(size_type)in_stack_fffffffffffff988);
                  *(undefined4 *)
                   ((long)&(pvVar12->
                           super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                           )._M_impl.super__Vector_impl_data._M_finish + 4) = *(undefined4 *)pvVar11
                  ;
                  swap4((int *)(local_10 + 2));
                  swap4((int *)((long)&local_10[2].
                                       super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 4));
                  swap4((int *)&local_10[2].
                                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
                  swap4((int *)((long)&local_10[2].
                                       super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 4));
                  local_43 = 1;
                }
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)local_80);
                if (iVar5 == 0) {
                  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    (&local_b8);
                  if (0xf < sVar8) {
                    pvVar12 = local_10 + 2;
                    pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         CONCAT17(in_stack_fffffffffffff997,
                                                  in_stack_fffffffffffff990),
                                         (size_type)in_stack_fffffffffffff988);
                    *(undefined4 *)
                     ((long)&(pvVar12->
                             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                             )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                         *(undefined4 *)pvVar11;
                    pvVar12 = local_10 + 3;
                    pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         CONCAT17(in_stack_fffffffffffff997,
                                                  in_stack_fffffffffffff990),
                                         (size_type)in_stack_fffffffffffff988);
                    *(undefined4 *)
                     &(pvVar12->
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pvVar11;
                    pvVar12 = local_10 + 3;
                    pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         CONCAT17(in_stack_fffffffffffff997,
                                                  in_stack_fffffffffffff990),
                                         (size_type)in_stack_fffffffffffff988);
                    *(undefined4 *)
                     ((long)&(pvVar12->
                             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start + 4) =
                         *(undefined4 *)pvVar11;
                    pvVar12 = local_10 + 3;
                    pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         CONCAT17(in_stack_fffffffffffff997,
                                                  in_stack_fffffffffffff990),
                                         (size_type)in_stack_fffffffffffff988);
                    *(undefined4 *)
                     &(pvVar12->
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      )._M_impl.super__Vector_impl_data._M_finish = *(undefined4 *)pvVar11;
                    swap4((int *)((long)&local_10[2].
                                         super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                    swap4((int *)(local_10 + 3));
                    swap4((int *)((long)&local_10[3].
                                         super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4));
                    swap4((int *)&local_10[3].
                                  super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
                    local_44 = 1;
                  }
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)local_80);
                  if (iVar5 == 0) {
                    sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                      (&local_b8);
                    if (sVar8 != 0) {
                      pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                operator[](&local_b8,0);
                      *(uint *)&local_10[2].
                                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage = (uint)*pbVar10;
                      local_45 = 1;
                    }
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)local_80);
                    if (iVar5 == 0) {
                      sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                        (&local_b8);
                      if (3 < sVar8) {
                        pvVar12 = local_10 + 4;
                        pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)CONCAT17(in_stack_fffffffffffff997,
                                                         in_stack_fffffffffffff990),
                                             (size_type)in_stack_fffffffffffff988);
                        *(undefined4 *)
                         &(pvVar12->
                          super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                          )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pvVar11;
                        swap4((float *)(local_10 + 4));
                        local_46 = 1;
                      }
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)local_80);
                      if (iVar5 == 0) {
                        sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                          (&local_b8);
                        if (7 < sVar8) {
                          pvVar12 = local_10 + 3;
                          pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)CONCAT17(in_stack_fffffffffffff997,
                                                           in_stack_fffffffffffff990),
                                               (size_type)in_stack_fffffffffffff988);
                          *(undefined4 *)
                           ((long)&(pvVar12->
                                   super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + 4) =
                               *(undefined4 *)pvVar11;
                          in_stack_fffffffffffffa40 =
                               (string *)
                               &local_10[3].
                                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          in_stack_fffffffffffffa48 =
                               (string *)
                               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          CONCAT17(in_stack_fffffffffffff997,
                                                   in_stack_fffffffffffff990),
                                          (size_type)in_stack_fffffffffffff988);
                          uVar1 = *(undefined3 *)&in_stack_fffffffffffffa48->field_0x1;
                          in_stack_fffffffffffffa40->_M_dataplus =
                               in_stack_fffffffffffffa48->_M_dataplus;
                          *(undefined3 *)&in_stack_fffffffffffffa40->field_0x1 = uVar1;
                          swap4((float *)((long)&local_10[3].
                                                 super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 4));
                          swap4((float *)&local_10[3].
                                          super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          local_47 = 1;
                        }
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)local_80);
                        if (iVar5 == 0) {
                          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                            (&local_b8);
                          if (3 < sVar8) {
                            in_stack_fffffffffffffa30 =
                                 (size_t *)
                                 ((long)&local_10[3].
                                         super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
                            in_stack_fffffffffffffa38 =
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )CONCAT17(in_stack_fffffffffffff997,
                                                      in_stack_fffffffffffff990),
                                            (size_type)in_stack_fffffffffffff988);
                            *(undefined4 *)in_stack_fffffffffffffa30 =
                                 *(undefined4 *)
                                  &(in_stack_fffffffffffffa38->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                            swap4((float *)((long)&local_10[3].
                                                                                                      
                                                  super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
                            local_48 = 1;
                          }
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare((char *)local_80);
                          if (iVar5 == 0) {
                            sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                              (&local_b8);
                            if (3 < sVar8) {
                              in_stack_fffffffffffffa20 =
                                   (undefined4 *)
                                   ((long)&local_10[4].
                                           super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 4);
                              in_stack_fffffffffffffa28 =
                                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)CONCAT17(in_stack_fffffffffffff997,
                                                          in_stack_fffffffffffff990),
                                              (size_type)in_stack_fffffffffffff988);
                              *in_stack_fffffffffffffa20 = *(undefined4 *)in_stack_fffffffffffffa28;
                              swap4((int *)((long)&local_10[4].
                                                                                                      
                                                  super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4));
                            }
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)local_80);
                            if (iVar5 == 0) {
                              bVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                      empty((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )in_stack_fffffffffffff9a0);
                              if ((!bVar3) &&
                                 (pvVar11 = std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            operator[](&local_b8,0), *pvVar11 != '\0')) {
                                local_db = 0;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                push_back((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          CONCAT17(in_stack_fffffffffffff997,
                                                   in_stack_fffffffffffff990),
                                          in_stack_fffffffffffff988);
                                pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::operator[](&local_b8,0);
                                local_e8 = strlen((char *)pvVar11);
                                std::__cxx11::string::resize
                                          ((ulong)&local_10[5].
                                                                                                      
                                                  super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          );
                                in_stack_fffffffffffffa18 =
                                     &local_10[5].
                                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::operator[](&local_b8,0);
                                std::__cxx11::string::assign
                                          ((char *)in_stack_fffffffffffffa18,(ulong)pvVar11);
                                local_49 = 1;
                              }
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)local_80);
                              if (iVar5 == 0) {
                                bVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                        empty((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)in_stack_fffffffffffff9a0);
                                if ((!bVar3) &&
                                   (pvVar11 = std::
                                              vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              ::operator[](&local_b8,0), *pvVar11 != '\0')) {
                                  local_e9 = 0;
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                  push_back((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )CONCAT17(in_stack_fffffffffffff997,
                                                      in_stack_fffffffffffff990),
                                            in_stack_fffffffffffff988);
                                  pvVar11 = std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            operator[](&local_b8,0);
                                  local_f8 = strlen((char *)pvVar11);
                                  std::__cxx11::string::resize((ulong)(local_10 + 7));
                                  in_stack_fffffffffffffa10 = local_10 + 7;
                                  pvVar11 = std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            operator[](&local_b8,0);
                                  std::__cxx11::string::assign
                                            ((char *)in_stack_fffffffffffffa10,(ulong)pvVar11);
                                  local_4a = 1;
                                }
                              }
                              else {
                                sVar8 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::
                                        size((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                                              *)(local_10 + 1));
                                if (sVar8 < 0x80) {
                                  pcVar13 = (char *)std::__cxx11::string::c_str();
                                  strncpy(local_308,pcVar13,0xff);
                                  pcVar13 = (char *)std::__cxx11::string::c_str();
                                  strncpy(local_208,pcVar13,0xff);
                                  local_209 = 0;
                                  local_109 = 0;
                                  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::size(&local_b8);
                                  local_100 = (undefined4)sVar8;
                                  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::size(&local_b8);
                                  __dest = malloc(sVar8);
                                  local_108 = __dest;
                                  pvVar11 = std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)CONCAT17(in_stack_fffffffffffff997,
                                                           in_stack_fffffffffffff990),
                                               (size_type)in_stack_fffffffffffff988);
                                  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::size(&local_b8);
                                  memcpy(__dest,pvVar11,sVar8);
                                  std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::
                                  push_back(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_005028e8:
              local_d0 = 0;
            }
          }
        }
        else {
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_b8);
          if (sVar8 == 9) {
            puVar9 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990
                                                ),(size_type)in_stack_fffffffffffff988);
            local_d4 = *puVar9;
            puVar9 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990
                                                ),(size_type)in_stack_fffffffffffff988);
            local_d8 = *puVar9;
            pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&local_b8,8);
            local_d9 = *pbVar10;
            swap4(&local_d4);
            swap4(&local_d8);
            uVar7 = local_d4;
            uVar6 = std::numeric_limits<int>::max();
            uVar2 = local_d8;
            if ((uVar7 <= uVar6) && (uVar7 = std::numeric_limits<int>::max(), uVar2 <= uVar7)) {
              *(uint *)((long)&local_10[4].
                               super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4) = local_d4;
              *(uint *)&local_10[4].
                        super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_d8;
              *(uint *)((long)&local_10[4].
                               super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                   local_d9 & 3;
              *(uint *)&local_10[5].
                        super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start = (int)(uint)local_d9 >> 4 & 1;
              *(undefined4 *)
               &local_10[4].
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish = 1;
              goto LAB_005028e8;
            }
            if (local_28 != (string *)0x0) {
              std::__cxx11::string::operator=(local_28,"Tile sizes were invalid.");
            }
            local_4 = -8;
            local_d0 = 1;
          }
          else {
            if (local_28 != (string *)0x0) {
              std::__cxx11::string::operator+=
                        (local_28,
                         "(ParseEXRHeader) Invalid attribute data size. Attribute data size must be 9.\n"
                        );
            }
            local_4 = -4;
            local_d0 = 1;
          }
        }
      }
      else {
        if (local_28 != (string *)0x0) {
          std::__cxx11::string::operator+=(local_28,"Failed to read attribute.\n");
        }
        local_4 = -4;
        local_d0 = 1;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff9a0)
      ;
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_80);
      if (local_d0 != 0) {
        return local_4;
      }
    }
    std::__cxx11::stringstream::stringstream(local_490);
    if ((local_42 & 1) == 0) {
      poVar14 = std::operator<<(local_480,"\"compression\" attribute not found in the header.");
      std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    }
    if ((local_41 & 1) == 0) {
      poVar14 = std::operator<<(local_480,"\"channels\" attribute not found in the header.");
      std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    }
    if ((local_45 & 1) == 0) {
      poVar14 = std::operator<<(local_480,"\"lineOrder\" attribute not found in the header.");
      std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    }
    if ((local_44 & 1) == 0) {
      poVar14 = std::operator<<(local_480,"\"displayWindow\" attribute not found in the header.");
      std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    }
    if ((local_43 & 1) == 0) {
      poVar14 = std::operator<<(local_480,
                                "\"dataWindow\" attribute not found in the header or invalid.");
      std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    }
    if ((local_46 & 1) == 0) {
      poVar14 = std::operator<<(local_480,"\"pixelAspectRatio\" attribute not found in the header.")
      ;
      std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    }
    if ((local_48 & 1) == 0) {
      poVar14 = std::operator<<(local_480,"\"screenWindowWidth\" attribute not found in the header."
                               );
      std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    }
    if ((local_47 & 1) == 0) {
      poVar14 = std::operator<<(local_480,
                                "\"screenWindowCenter\" attribute not found in the header.");
      std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
    }
    if ((*(int *)(local_20 + 0x10) != 0) || (*(int *)(local_20 + 0xc) != 0)) {
      if ((local_49 & 1) == 0) {
        poVar14 = std::operator<<(local_480,"\"name\" attribute not found in the header.");
        std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
      }
      if ((local_4a & 1) == 0) {
        poVar14 = std::operator<<(local_480,"\"type\" attribute not found in the header.");
        std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
      }
    }
    std::__cxx11::stringstream::str();
    bVar4 = std::__cxx11::string::empty();
    bVar4 = bVar4 ^ 0xff;
    std::__cxx11::string::~string(local_4b0);
    if ((bVar4 & 1) == 0) {
      local_d0 = 0;
    }
    else {
      if (local_28 != (string *)0x0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_28,local_4d0);
        std::__cxx11::string::~string(local_4d0);
      }
      local_4 = -9;
      local_d0 = 1;
    }
    std::__cxx11::stringstream::~stringstream(local_490);
    if (local_d0 == 0) {
      *(int *)((long)&local_10[5].
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start + 4) = (int)local_58 - (int)local_38
      ;
      local_4 = 0;
    }
  }
  else {
    if (in_RSI != (undefined1 *)0x0) {
      *in_RSI = 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int ParseEXRHeader(HeaderInfo *info, bool *empty_header,
                          const EXRVersion *version, std::string *err,
                          const unsigned char *buf, size_t size) {
  const char *marker = reinterpret_cast<const char *>(&buf[0]);

  if (empty_header) {
    (*empty_header) = false;
  }

  if (version->multipart) {
    if (size > 0 && marker[0] == '\0') {
      // End of header list.
      if (empty_header) {
        (*empty_header) = true;
      }
      return TINYEXR_SUCCESS;
    }
  }

  // According to the spec, the header of every OpenEXR file must contain at
  // least the following attributes:
  //
  // channels chlist
  // compression compression
  // dataWindow box2i
  // displayWindow box2i
  // lineOrder lineOrder
  // pixelAspectRatio float
  // screenWindowCenter v2f
  // screenWindowWidth float
  bool has_channels = false;
  bool has_compression = false;
  bool has_data_window = false;
  bool has_display_window = false;
  bool has_line_order = false;
  bool has_pixel_aspect_ratio = false;
  bool has_screen_window_center = false;
  bool has_screen_window_width = false;
  bool has_name = false;
  bool has_type = false;

  info->name.clear();
  info->type.clear();

  info->data_window.min_x = 0;
  info->data_window.min_y = 0;
  info->data_window.max_x = 0;
  info->data_window.max_y = 0;
  info->line_order = 0;  // @fixme
  info->display_window.min_x = 0;
  info->display_window.min_y = 0;
  info->display_window.max_x = 0;
  info->display_window.max_y = 0;
  info->screen_window_center[0] = 0.0f;
  info->screen_window_center[1] = 0.0f;
  info->screen_window_width = -1.0f;
  info->pixel_aspect_ratio = -1.0f;

  info->tiled = 0;
  info->tile_size_x = -1;
  info->tile_size_y = -1;
  info->tile_level_mode = -1;
  info->tile_rounding_mode = -1;

  info->attributes.clear();

  // Read attributes
  size_t orig_size = size;
  for (size_t nattr = 0; nattr < TINYEXR_MAX_HEADER_ATTRIBUTES; nattr++) {
    if (0 == size) {
      if (err) {
        (*err) += "Insufficient data size for attributes.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    } else if (marker[0] == '\0') {
      size--;
      break;
    }

    std::string attr_name;
    std::string attr_type;
    std::vector<unsigned char> data;
    size_t marker_size;
    if (!tinyexr::ReadAttribute(&attr_name, &attr_type, &data, &marker_size,
                                marker, size)) {
      if (err) {
        (*err) += "Failed to read attribute.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
    marker += marker_size;
    size -= marker_size;

    // For a multipart file, the version field 9th bit is 0.
    if ((version->tiled || version->multipart || version->non_image) && attr_name.compare("tiles") == 0) {
      unsigned int x_size, y_size;
      unsigned char tile_mode;
      if (data.size() != 9) {
        if (err) {
          (*err) += "(ParseEXRHeader) Invalid attribute data size. Attribute data size must be 9.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      assert(data.size() == 9);
      memcpy(&x_size, &data.at(0), sizeof(int));
      memcpy(&y_size, &data.at(4), sizeof(int));
      tile_mode = data[8];
      tinyexr::swap4(&x_size);
      tinyexr::swap4(&y_size);

      if (x_size > static_cast<unsigned int>(std::numeric_limits<int>::max()) ||
          y_size > static_cast<unsigned int>(std::numeric_limits<int>::max())) {
        if (err) {
          (*err) = "Tile sizes were invalid.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->tile_size_x = static_cast<int>(x_size);
      info->tile_size_y = static_cast<int>(y_size);

      // mode = levelMode + roundingMode * 16
      info->tile_level_mode = tile_mode & 0x3;
      info->tile_rounding_mode = (tile_mode >> 4) & 0x1;
      info->tiled = 1;
    } else if (attr_name.compare("compression") == 0) {
      bool ok = false;
      if (data[0] < TINYEXR_COMPRESSIONTYPE_PIZ) {
        ok = true;
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
        ok = true;
#else
        if (err) {
          (*err) = "PIZ compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
        ok = true;
#else
        if (err) {
          (*err) = "ZFP compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (!ok) {
        if (err) {
          (*err) = "Unknown compression type.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->compression_type = static_cast<int>(data[0]);
      has_compression = true;

    } else if (attr_name.compare("channels") == 0) {
      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      if (!ReadChannelInfo(info->channels, data)) {
        if (err) {
          (*err) += "Failed to parse channel info.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      if (info->channels.size() < 1) {
        if (err) {
          (*err) += "# of channels is zero.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      has_channels = true;

    } else if (attr_name.compare("dataWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->data_window.min_x, &data.at(0), sizeof(int));
        memcpy(&info->data_window.min_y, &data.at(4), sizeof(int));
        memcpy(&info->data_window.max_x, &data.at(8), sizeof(int));
        memcpy(&info->data_window.max_y, &data.at(12), sizeof(int));
        tinyexr::swap4(&info->data_window.min_x);
        tinyexr::swap4(&info->data_window.min_y);
        tinyexr::swap4(&info->data_window.max_x);
        tinyexr::swap4(&info->data_window.max_y);
        has_data_window = true;
      }
    } else if (attr_name.compare("displayWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->display_window.min_x, &data.at(0), sizeof(int));
        memcpy(&info->display_window.min_y, &data.at(4), sizeof(int));
        memcpy(&info->display_window.max_x, &data.at(8), sizeof(int));
        memcpy(&info->display_window.max_y, &data.at(12), sizeof(int));
        tinyexr::swap4(&info->display_window.min_x);
        tinyexr::swap4(&info->display_window.min_y);
        tinyexr::swap4(&info->display_window.max_x);
        tinyexr::swap4(&info->display_window.max_y);

        has_display_window = true;
      }
    } else if (attr_name.compare("lineOrder") == 0) {
      if (data.size() >= 1) {
        info->line_order = static_cast<int>(data[0]);
        has_line_order = true;
      }
    } else if (attr_name.compare("pixelAspectRatio") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->pixel_aspect_ratio, &data.at(0), sizeof(float));
        tinyexr::swap4(&info->pixel_aspect_ratio);
        has_pixel_aspect_ratio = true;
      }
    } else if (attr_name.compare("screenWindowCenter") == 0) {
      if (data.size() >= 8) {
        memcpy(&info->screen_window_center[0], &data.at(0), sizeof(float));
        memcpy(&info->screen_window_center[1], &data.at(4), sizeof(float));
        tinyexr::swap4(&info->screen_window_center[0]);
        tinyexr::swap4(&info->screen_window_center[1]);
        has_screen_window_center = true;
      }
    } else if (attr_name.compare("screenWindowWidth") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->screen_window_width, &data.at(0), sizeof(float));
        tinyexr::swap4(&info->screen_window_width);

        has_screen_window_width = true;
      }
    } else if (attr_name.compare("chunkCount") == 0) {
      if (data.size() >= sizeof(int)) {
        memcpy(&info->chunk_count, &data.at(0), sizeof(int));
        tinyexr::swap4(&info->chunk_count);
      }
    } else if (attr_name.compare("name") == 0) {
      if (!data.empty() && data[0]) {
        data.push_back(0);
        size_t len = strlen(reinterpret_cast<const char*>(&data[0]));
        info->name.resize(len);
        info->name.assign(reinterpret_cast<const char*>(&data[0]), len);
        has_name = true;
      }
    } else if (attr_name.compare("type") == 0) {
      if (!data.empty() && data[0]) {
        data.push_back(0);
        size_t len = strlen(reinterpret_cast<const char*>(&data[0]));
        info->type.resize(len);
        info->type.assign(reinterpret_cast<const char*>(&data[0]), len);
        has_type = true;
      }
    } else {
      // Custom attribute(up to TINYEXR_MAX_CUSTOM_ATTRIBUTES)
      if (info->attributes.size() < TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
        EXRAttribute attrib;
#ifdef _MSC_VER
        strncpy_s(attrib.name, attr_name.c_str(), 255);
        strncpy_s(attrib.type, attr_type.c_str(), 255);
#else
        strncpy(attrib.name, attr_name.c_str(), 255);
        strncpy(attrib.type, attr_type.c_str(), 255);
#endif
        attrib.name[255] = '\0';
        attrib.type[255] = '\0';
        //std::cout << "i = " << info->attributes.size() << ", dsize = " << data.size() << "\n";
        attrib.size = static_cast<int>(data.size());
        attrib.value = static_cast<unsigned char *>(malloc(data.size()));
        memcpy(reinterpret_cast<char *>(attrib.value), &data.at(0),
               data.size());
        info->attributes.push_back(attrib);
      }
    }
  }

  // Check if required attributes exist
  {
    std::stringstream ss_err;

    if (!has_compression) {
      ss_err << "\"compression\" attribute not found in the header."
             << std::endl;
    }

    if (!has_channels) {
      ss_err << "\"channels\" attribute not found in the header." << std::endl;
    }

    if (!has_line_order) {
      ss_err << "\"lineOrder\" attribute not found in the header." << std::endl;
    }

    if (!has_display_window) {
      ss_err << "\"displayWindow\" attribute not found in the header."
             << std::endl;
    }

    if (!has_data_window) {
      ss_err << "\"dataWindow\" attribute not found in the header or invalid."
             << std::endl;
    }

    if (!has_pixel_aspect_ratio) {
      ss_err << "\"pixelAspectRatio\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_width) {
      ss_err << "\"screenWindowWidth\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_center) {
      ss_err << "\"screenWindowCenter\" attribute not found in the header."
             << std::endl;
    }

    if (version->multipart || version->non_image) {
      if (!has_name) {
        ss_err << "\"name\" attribute not found in the header."
          << std::endl;
      }
      if (!has_type) {
        ss_err << "\"type\" attribute not found in the header."
          << std::endl;
      }
    }

    if (!(ss_err.str().empty())) {
      if (err) {
        (*err) += ss_err.str();
      }

      return TINYEXR_ERROR_INVALID_HEADER;
    }
  }

  info->header_len = static_cast<unsigned int>(orig_size - size);

  return TINYEXR_SUCCESS;
}